

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

QByteArray * __thiscall QByteArray::replace(QByteArray *this,char before,char after)

{
  Data *pDVar1;
  char *pcVar2;
  size_t sVar3;
  qsizetype qVar4;
  char *pcVar5;
  size_t __n;
  char cVar6;
  ptrdiff_t _Num;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_58;
  char local_32;
  char local_31;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_32 = after;
  local_31 = before;
  if (before != after) {
    __n = indexOf(this,before,0);
    if (-1 < (long)__n) {
      pDVar1 = (this->d).d;
      if ((pDVar1 == (Data *)0x0) ||
         (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray((QByteArray *)&local_58,(this->d).size,Uninitialized);
        pcVar5 = local_58.ptr;
        if (__n != 0) {
          memmove(local_58.ptr,(this->d).ptr,__n);
        }
        pcVar5[__n] = after;
        pcVar2 = (this->d).ptr;
        sVar3 = (this->d).size;
        while (__n = __n + 1, sVar3 != __n) {
          cVar6 = pcVar2[__n];
          if (cVar6 == before) {
            cVar6 = after;
          }
          pcVar5[__n] = cVar6;
        }
        pDVar1 = (this->d).d;
        pcVar5 = (this->d).ptr;
        (this->d).d = local_58.d;
        (this->d).ptr = local_58.ptr;
        qVar4 = (this->d).size;
        (this->d).size = local_58.size;
        local_58.d = pDVar1;
        local_58.ptr = pcVar5;
        local_58.size = qVar4;
        QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
      }
      else {
        (this->d).ptr[__n] = after;
        pcVar5 = (this->d).ptr;
        std::replace<char*,char>(pcVar5 + __n + 1,pcVar5 + (this->d).size,&local_31,&local_32);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray &QByteArray::replace(char before, char after)
{
    if (before != after) {
        if (const auto pos = indexOf(before); pos >= 0) {
            if (d.needsDetach()) {
                QByteArray tmp(size(), Qt::Uninitialized);
                auto dst = tmp.d.data();
                dst = std::copy(d.data(), d.data() + pos, dst);
                *dst++ = after;
                std::replace_copy(d.data() + pos + 1, d.end(), dst, before, after);
                swap(tmp);
            } else {
                // in-place
                d.data()[pos] = after;
                std::replace(d.data() + pos + 1, d.end(), before, after);
            }
        }
    }
    return *this;
}